

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

value_type __thiscall djb::npf::eval(npf *this,vec3 *dirIn,vec3 *dirOut,void *param_3)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  double dVar7;
  pointer pvVar8;
  long lVar9;
  int iVar10;
  float *extraout_RDX;
  float *pfVar11;
  float *extraout_RDX_00;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  value_type vVar25;
  float local_98;
  float fStack_94;
  float local_78;
  float fStack_74;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  if ((0.0 <= dirOut->z) && (0.0 <= *(float *)((long)param_3 + 8))) {
    fVar18 = dirOut->x + *param_3;
    fVar21 = dirOut->y + *(float *)((long)param_3 + 4);
    fVar17 = dirOut->z + *(float *)((long)param_3 + 8);
    fVar13 = fVar17 * fVar17 + fVar18 * fVar18 + fVar21 * fVar21;
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      if (fVar13 <= 0.0) {
        __assert_fail("x > T(0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                      ,0x259,"T djb::inversesqrt(const T &) [T = float]");
      }
      if (fVar13 < 0.0) {
        fVar13 = sqrtf(fVar13);
      }
      else {
        fVar13 = SQRT(fVar13);
      }
      fVar13 = 1.0 / fVar13;
      fVar16 = fVar18 * fVar13 * 0.0 + fVar21 * fVar13 * 0.0 + fVar17 * fVar13;
      fVar14 = 0.0;
      if (0.0 <= fVar16) {
        fVar14 = fVar16;
      }
      fVar16 = 1.0;
      if (fVar14 <= 1.0) {
        fVar16 = fVar14;
      }
      fVar14 = acosf(fVar16);
      fVar17 = fVar17 * fVar13 * dirOut->z +
               fVar18 * fVar13 * dirOut->x + fVar21 * fVar13 * dirOut->y;
      fVar13 = 0.0;
      if (0.0 <= fVar17) {
        fVar13 = fVar17;
      }
      fVar17 = 1.0;
      if (fVar13 <= 1.0) {
        fVar17 = fVar13;
      }
      fVar17 = acosf(fVar17);
      fVar18 = dirOut->x * 0.0 + dirOut->y * 0.0 + dirOut->z;
      fVar13 = 0.0;
      if (0.0 <= fVar18) {
        fVar13 = fVar18;
      }
      fVar18 = 1.0;
      if (fVar13 <= 1.0) {
        fVar18 = fVar13;
      }
      fVar18 = acosf(fVar18);
      fVar21 = *param_3 * 0.0 + *(float *)((long)param_3 + 4) * 0.0 + *(float *)((long)param_3 + 8);
      fVar13 = 0.0;
      if (0.0 <= fVar21) {
        fVar13 = fVar21;
      }
      fVar21 = 1.0;
      if (fVar13 <= 1.0) {
        fVar21 = fVar13;
      }
      fVar16 = acosf(fVar21);
      lVar6 = *(long *)&dirIn->z;
      lVar9 = (long)(int)dirIn[2].z * 0x1800;
      uVar1 = *(undefined8 *)(lVar6 + lVar9);
      fVar13 = *(float *)(lVar6 + 8 + lVar9);
      lVar9 = (long)((int)dirIn[2].z * 0x200 + 1);
      uVar2 = *(undefined8 *)(lVar6 + lVar9 * 0xc);
      fVar21 = *(float *)(lVar6 + 8 + lVar9 * 0xc);
      dVar24 = ((double)fVar14 / 3.141592653589793) * 0.5 * 90.0 * 90.0;
      if (dVar24 < 0.0) {
        dVar24 = sqrt(dVar24);
      }
      else {
        dVar24 = SQRT(dVar24);
      }
      dVar7 = 0.0;
      if (0.0 <= dVar24) {
        dVar7 = dVar24;
      }
      dVar24 = 89.0;
      if (dVar7 <= 89.0) {
        dVar24 = dVar7;
      }
      if (*(char *)&dirIn[3].x == '\x01') {
        printf("iD: %i\n");
      }
      lVar9 = (long)(int)dirIn[2].z * 0x200;
      lVar6 = *(long *)&dirIn->z;
      lVar12 = (long)(int)dVar24 + 2 + lVar9;
      fVar14 = (fVar18 / 3.1415927) * 0.5 * 90.0;
      uVar3 = *(undefined8 *)(lVar6 + lVar12 * 0xc);
      fVar22 = 0.0;
      if (0.0 <= fVar14) {
        fVar22 = fVar14;
      }
      fVar14 = 89.0;
      if (fVar22 <= 89.0) {
        fVar14 = fVar22;
      }
      iVar10 = (int)lVar9;
      lVar9 = (long)((int)(fVar14 + 2.0 + 90.0) + iVar10);
      uVar4 = *(undefined8 *)(lVar6 + lVar9 * 0xc);
      fVar14 = (fVar16 / 3.1415927) * 0.5 * 90.0;
      fVar22 = 0.0;
      if (0.0 <= fVar14) {
        fVar22 = fVar14;
      }
      fVar14 = *(float *)(lVar6 + 8 + lVar9 * 0xc);
      fVar19 = 89.0;
      if (fVar22 <= 89.0) {
        fVar19 = fVar22;
      }
      lVar9 = (long)((int)(fVar19 + 2.0 + 90.0) + iVar10);
      uVar5 = *(undefined8 *)(lVar6 + lVar9 * 0xc);
      fVar22 = *(float *)(lVar6 + 8 + lVar9 * 0xc);
      dVar24 = ((double)fVar17 / 3.141592653589793) * 0.5 * 90.0;
      dVar7 = 0.0;
      if (0.0 <= dVar24) {
        dVar7 = dVar24;
      }
      dVar24 = 89.0;
      if (dVar7 <= 89.0) {
        dVar24 = dVar7;
      }
      local_78 = (float)uVar2;
      fStack_74 = (float)((ulong)uVar2 >> 0x20);
      lVar9 = (long)((int)dVar24 + 0xb6 + iVar10);
      uVar2 = *(undefined8 *)(lVar6 + lVar9 * 0xc);
      fVar17 = *(float *)(lVar6 + 8 + lVar12 * 0xc);
      fVar19 = *(float *)(lVar6 + 8 + lVar9 * 0xc);
      fVar15 = cosf(fVar18);
      fVar15 = 1.0 / fVar15;
      local_98 = (float)uVar4;
      fStack_94 = (float)((ulong)uVar4 >> 0x20);
      fVar16 = cosf(fVar16);
      fVar16 = 1.0 / fVar16;
      local_38 = (float)uVar5;
      fStack_34 = (float)((ulong)uVar5 >> 0x20);
      local_48 = (float)uVar1;
      fStack_44 = (float)((ulong)uVar1 >> 0x20);
      fVar18 = *(float *)((long)param_3 + 8);
      fVar23 = (local_38 * fVar16 * local_98 * fVar15 * (float)uVar2 * local_78 * (float)uVar3 +
               local_48) * fVar18 * 0.0625;
      fVar20 = (fStack_44 +
               fStack_34 * fVar16 *
               fStack_94 * fVar15 *
               (float)((ulong)uVar2 >> 0x20) * fStack_74 * (float)((ulong)uVar3 >> 0x20)) * fVar18 *
               0.0625;
      fVar17 = (fVar13 + fVar16 * fVar22 * fVar15 * fVar14 * fVar21 * fVar17 * fVar19) * fVar18 *
               0.0625;
      *(undefined1 *)&dirIn[3].x = 0;
      fVar13 = fVar17 * fVar17 + fVar23 * fVar23 + fVar20 * fVar20;
      if ((!NAN(fVar13)) && (ABS(fVar13) <= 10000.0)) {
        (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)0x3;
        pvVar8 = (pointer)operator_new(0xc);
        (this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>._M_impl.
        super__Vector_impl_data._M_start = pvVar8;
        pvVar8->x = fVar23;
        pvVar8->y = fVar20;
        pvVar8->z = fVar17;
        pfVar11 = extraout_RDX_00;
        goto LAB_00146aca;
      }
    }
  }
  (**(code **)(*(long *)dirIn + 0x10))(this,dirIn);
  pfVar11 = extraout_RDX;
LAB_00146aca:
  vVar25._M_data = pfVar11;
  vVar25._M_size = (size_t)this;
  return vVar25;
}

Assistant:

brdf::value_type npf::eval(const vec3 &dirIn, const vec3 &dirOut, const void *) const
{
	if (dirIn.z < 0 || dirOut.z < 0)
		return zero_value();

	vec3 tmp = dirIn + dirOut;
	float_t nrm = dot(tmp, tmp);

	if (nrm == 0)
		return zero_value();
	vec3 dirNormal = vec3(0, 0, 1);
	vec3 dirH = tmp * inversesqrt(nrm);
	float thetaH = acos(sat(dot(dirH, dirNormal)));
	float thetaD = acos(sat(dot(dirIn, dirH)));
	float thetaI = acos(sat(dot(dirIn, dirNormal)));
	float thetaO = acos(sat(dot(dirOut, dirNormal)));

	// BRDF texture has a fixed size of 512x256
	vec2 uv;
	uv.y = float(m_id)/256.;

	uv.x = 0.0/512.;
	vec3 rhoD = uberTextureLookup(uv);
	//if (m_first) printf("%f %f %f\n", rhoD.x, rhoD.y, rhoD.z); //OK

	uv.x = 1.0/512.;
	vec3 rhoS = uberTextureLookup(uv);
	//if (m_first) printf("%f %f %f\n", rhoS.x, rhoS.y, rhoS.z); //OK

	int iD = int(clamp(sqrt(thetaH / M_PI / 2
	             * 90.0 * 90.0), 0.0, 89.0));
	uv.x = float(iD+2)/512.;
	if (m_first)
		printf("iD: %i\n", iD);
	vec3 D = uberTextureLookup(uv);
	D = uberTextureLookupInt(iD+2); //OK

	vec3 G1I = lookupInterpolatedG1(m_id, thetaI);

	vec3 G1O = lookupInterpolatedG1(m_id, thetaO);

	auto tmp2 = thetaD / M_PI / 2 * 90.0;
	int iF = int(clamp(tmp2, 0.0, 89.0));
	uv.x = float(iF+2+90+90)/512.;
	vec3 F = uberTextureLookup(uv);
	F = uberTextureLookupInt(iF+2+90+90); //OK

	vec3 BRDF = (rhoD) + (rhoS) * D * F *
	            (G1I / cos(thetaI)) * (G1O / cos(thetaO));
	BRDF*= dirOut.z;
	BRDF*= 1.0 / 16;

	m_first = false;

	if (fabs(dot(BRDF, BRDF)) > 9999.9999f || std::isnan(dot(BRDF, BRDF))) {
		return zero_value();
	}

	return brdf::value_type({BRDF.x, BRDF.y, BRDF.z});
}